

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_diag_gen(REF_INT n,REF_DBL *a,REF_DBL *values,REF_DBL *vectors)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_DBL *ab_00;
  REF_DBL *a_00;
  REF_DBL *a_01;
  REF_DBL *q_00;
  REF_DBL *r_00;
  int iVar3;
  double dVar4;
  REF_DBL local_d8;
  double local_d0;
  double local_c0;
  double local_b8;
  REF_DBL local_b0;
  REF_DBL local_a8;
  double local_a0;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL len;
  REF_DBL convm;
  REF_DBL conv;
  REF_DBL trace;
  REF_DBL max_lower;
  REF_INT iter;
  REF_INT k;
  REF_INT j;
  REF_INT i;
  REF_DBL *ab;
  REF_DBL *qq;
  REF_DBL *rq;
  REF_DBL *r;
  REF_DBL *q;
  REF_DBL *vectors_local;
  REF_DBL *values_local;
  REF_DBL *a_local;
  REF_INT n_local;
  
  if (n * (n + 1) < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x418,
           "ref_matrix_diag_gen","malloc ab of REF_DBL negative");
    a_local._4_4_ = 1;
  }
  else {
    ab_00 = (REF_DBL *)malloc((long)(n * (n + 1)) << 3);
    if (ab_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x418,"ref_matrix_diag_gen","malloc ab of REF_DBL NULL");
      a_local._4_4_ = 2;
    }
    else if (n * n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x419,"ref_matrix_diag_gen","malloc qq of REF_DBL negative");
      a_local._4_4_ = 1;
    }
    else {
      a_00 = (REF_DBL *)malloc((long)(n * n) << 3);
      if (a_00 == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
               0x419,"ref_matrix_diag_gen","malloc qq of REF_DBL NULL");
        a_local._4_4_ = 2;
      }
      else if (n * n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
               0x41a,"ref_matrix_diag_gen","malloc rq of REF_DBL negative");
        a_local._4_4_ = 1;
      }
      else {
        a_01 = (REF_DBL *)malloc((long)(n * n) << 3);
        if (a_01 == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
                 0x41a,"ref_matrix_diag_gen","malloc rq of REF_DBL NULL");
          a_local._4_4_ = 2;
        }
        else if (n * n < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
                 0x41b,"ref_matrix_diag_gen","malloc q of REF_DBL negative");
          a_local._4_4_ = 1;
        }
        else {
          q_00 = (REF_DBL *)malloc((long)(n * n) << 3);
          if (q_00 == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c"
                   ,0x41b,"ref_matrix_diag_gen","malloc q of REF_DBL NULL");
            a_local._4_4_ = 2;
          }
          else if (n * n < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c"
                   ,0x41c,"ref_matrix_diag_gen","malloc r of REF_DBL negative");
            a_local._4_4_ = 1;
          }
          else {
            r_00 = (REF_DBL *)malloc((long)(n * n) << 3);
            if (r_00 == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c"
                     ,0x41c,"ref_matrix_diag_gen","malloc r of REF_DBL NULL");
              a_local._4_4_ = 2;
            }
            else {
              for (iter = 0; iter < n; iter = iter + 1) {
                for (k = 0; k < n; k = k + 1) {
                  a_01[k + iter * n] = a[k + iter * n];
                }
              }
              for (iter = 0; iter < n; iter = iter + 1) {
                for (k = 0; k < n; k = k + 1) {
                  vectors[k + iter * n] = 0.0;
                }
              }
              for (k = 0; k < n; k = k + 1) {
                vectors[k + k * n] = 1.0;
              }
              max_lower._0_4_ = 0;
              convm = 1.0;
              do {
                if (convm <= 1e-13) goto LAB_0019505c;
                max_lower._0_4_ = max_lower._0_4_ + 1;
                uVar1 = ref_matrix_qr(n,n,a_01,q_00,r_00);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c"
                         ,0x42a,"ref_matrix_diag_gen",(ulong)uVar1,"qr");
                  return uVar1;
                }
                ref_matrix_mult_gen(n,r_00,q_00,a_01);
                for (iter = 0; iter < n; iter = iter + 1) {
                  for (k = 0; k < n; k = k + 1) {
                    a_00[k + iter * n] = vectors[k + iter * n];
                  }
                }
                ref_matrix_mult_gen(n,a_00,q_00,vectors);
                trace = 0.0;
                for (iter = 0; k = iter, iter < n; iter = iter + 1) {
                  while (k = k + 1, k < n) {
                    if (a_01[k + iter * n] <= 0.0) {
                      local_a0 = -a_01[k + iter * n];
                    }
                    else {
                      local_a0 = a_01[k + iter * n];
                    }
                    if (trace <= local_a0) {
                      if (a_01[k + iter * n] <= 0.0) {
                        local_b0 = -a_01[k + iter * n];
                      }
                      else {
                        local_b0 = a_01[k + iter * n];
                      }
                      local_a8 = local_b0;
                    }
                    else {
                      local_a8 = trace;
                    }
                    trace = local_a8;
                  }
                }
                conv = 0.0;
                for (k = 0; k < n; k = k + 1) {
                  if (a_01[k + k * n] <= 0.0) {
                    local_b8 = -a_01[k + k * n];
                  }
                  else {
                    local_b8 = a_01[k + k * n];
                  }
                  conv = local_b8 + conv;
                }
                convm = trace / conv;
              } while ((int)max_lower._0_4_ < 0x7a121);
              for (k = 0; k < n; k = k + 1) {
                values[k] = a_01[k + k * n];
              }
              a_local._4_4_ = ref_matrix_show_eig(n,a,values,vectors);
              if (a_local._4_4_ == 0) {
                printf("conv before shift %e used %d\n",convm,(ulong)max_lower._0_4_);
LAB_0019505c:
                for (k = 0; k < n; k = k + 1) {
                  values[k] = a_01[k + k * n];
                }
                for (max_lower._4_4_ = 0; (int)max_lower._4_4_ < n;
                    max_lower._4_4_ = max_lower._4_4_ + 1) {
                  max_lower._0_4_ = 0;
                  convm = 1.0;
                  do {
                    if (convm <= 1e-13) goto LAB_00195625;
                    max_lower._0_4_ = max_lower._0_4_ + 1;
                    for (iter = 0; iter < n; iter = iter + 1) {
                      for (k = 0; k < n; k = k + 1) {
                        ab_00[k + iter * n] = a[k + iter * n];
                      }
                    }
                    for (k = 0; k < n; k = k + 1) {
                      iVar3 = k + k * n;
                      ab_00[iVar3] = values[(int)max_lower._4_4_] * -1.0001 + ab_00[iVar3];
                    }
                    for (k = 0; k < n; k = k + 1) {
                      ab_00[k + n * n] = vectors[(int)(k + max_lower._4_4_ * n)];
                    }
                    RVar2 = ref_matrix_solve_ab(n,n + 1,ab_00);
                    if (RVar2 != 0) {
                      ref_matrix_show_ab(n,n + 1,ab_00);
                      ref_matrix_show_eig(n,a,values,vectors);
                      printf("vectr %d conv %e used %d\n",convm,(ulong)max_lower._4_4_,
                             (ulong)max_lower._0_4_);
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c"
                             ,0x452,"ref_matrix_diag_gen","solve");
                      return 1;
                    }
                    _ref_private_macro_code_rss_1 = 0.0;
                    for (k = 0; k < n; k = k + 1) {
                      _ref_private_macro_code_rss_1 =
                           ab_00[k + n * n] * ab_00[k + n * n] + _ref_private_macro_code_rss_1;
                    }
                    dVar4 = sqrt(_ref_private_macro_code_rss_1);
                    for (k = 0; k < n; k = k + 1) {
                      if (dVar4 * 1e+20 <= 0.0) {
                        local_c0 = -(dVar4 * 1e+20);
                      }
                      else {
                        local_c0 = dVar4 * 1e+20;
                      }
                      if (ab_00[k + n * n] <= 0.0) {
                        local_d0 = -ab_00[k + n * n];
                      }
                      else {
                        local_d0 = ab_00[k + n * n];
                      }
                      if (local_c0 <= local_d0) {
                        return 4;
                      }
                      ab_00[k + n * n] = ab_00[k + n * n] / dVar4;
                    }
                    convm = 0.0;
                    for (k = 0; k < n; k = k + 1) {
                      convm = (vectors[(int)(k + max_lower._4_4_ * n)] - ab_00[k + n * n]) *
                              (vectors[(int)(k + max_lower._4_4_ * n)] - ab_00[k + n * n]) + convm;
                    }
                    len = 0.0;
                    for (k = 0; k < n; k = k + 1) {
                      len = (vectors[(int)(k + max_lower._4_4_ * n)] + ab_00[k + n * n]) *
                            (vectors[(int)(k + max_lower._4_4_ * n)] + ab_00[k + n * n]) + len;
                    }
                    if (len <= convm) {
                      local_d8 = len;
                    }
                    else {
                      local_d8 = convm;
                    }
                    convm = local_d8;
                    for (k = 0; k < n; k = k + 1) {
                      vectors[(int)(k + max_lower._4_4_ * n)] = ab_00[k + n * n];
                    }
                  } while ((int)max_lower._0_4_ < 0x186a1);
                  printf("vectr %d conv %e used %d\n",local_d8,(ulong)max_lower._4_4_,
                         (ulong)max_lower._0_4_);
LAB_00195625:
                }
                if (r_00 != (REF_DBL *)0x0) {
                  free(r_00);
                }
                if (q_00 != (REF_DBL *)0x0) {
                  free(q_00);
                }
                if (a_01 != (REF_DBL *)0x0) {
                  free(a_01);
                }
                if (a_00 != (REF_DBL *)0x0) {
                  free(a_00);
                }
                if (ab_00 != (REF_DBL *)0x0) {
                  free(ab_00);
                }
                a_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c"
                       ,0x43b,"ref_matrix_diag_gen",(ulong)a_local._4_4_,"show");
              }
            }
          }
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_diag_gen(REF_INT n, REF_DBL *a, REF_DBL *values,
                                       REF_DBL *vectors) {
  REF_DBL *q, *r, *rq, *qq, *ab;
  REF_INT i, j, k, iter;
  REF_DBL max_lower, trace, conv, convm;
  REF_DBL len;

  ref_malloc(ab, n * (n + 1), REF_DBL);
  ref_malloc(qq, n * n, REF_DBL);
  ref_malloc(rq, n * n, REF_DBL);
  ref_malloc(q, n * n, REF_DBL);
  ref_malloc(r, n * n, REF_DBL);

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) rq[i + j * n] = a[i + j * n];

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) vectors[i + j * n] = 0.0;
  for (i = 0; i < n; i++) vectors[i + i * n] = 1.0;

  iter = 0;
  conv = 1.0;
  while (conv > 1.0e-13) {
    iter++;

    RSS(ref_matrix_qr(n, n, rq, q, r), "qr");
    ref_matrix_mult_gen(n, r, q, rq);

    for (j = 0; j < n; j++)
      for (i = 0; i < n; i++) qq[i + j * n] = vectors[i + j * n];
    ref_matrix_mult_gen(n, qq, q, vectors);

    max_lower = 0.0;
    for (j = 0; j < n; j++)
      for (i = j + 1; i < n; i++)
        max_lower = MAX(max_lower, ABS(rq[i + j * n]));
    trace = 0.0;
    for (i = 0; i < n; i++) trace += ABS(rq[i + i * n]);
    conv = max_lower / trace;

    if (iter > 500000) {
      for (i = 0; i < n; i++) values[i] = rq[i + i * n];
      RSS(ref_matrix_show_eig(n, a, values, vectors), "show");
      printf("conv before shift %e used %d\n", conv, iter);
      break;
    }
  }

  for (i = 0; i < n; i++) values[i] = rq[i + i * n];

  for (k = 0; k < n; k++) {
    iter = 0;
    conv = 1.0;
    while (conv > 1.0e-13) {
      iter++;
      for (j = 0; j < n; j++)
        for (i = 0; i < n; i++) ab[i + j * n] = a[i + j * n];
      for (i = 0; i < n; i++) ab[i + i * n] -= 1.0001 * values[k];

      for (i = 0; i < n; i++) ab[i + n * n] = vectors[i + k * n];

      if (REF_SUCCESS != ref_matrix_solve_ab(n, n + 1, ab)) {
        ref_matrix_show_ab(n, n + 1, ab);
        ref_matrix_show_eig(n, a, values, vectors);
        printf("vectr %d conv %e used %d\n", k, conv, iter);
        THROW("solve");
      }

      len = 0.0;
      for (i = 0; i < n; i++) len += ab[i + n * n] * ab[i + n * n];
      len = sqrt(len);
      for (i = 0; i < n; i++) {
        if (!ref_math_divisible(ab[i + n * n], len)) return REF_DIV_ZERO;
        ab[i + n * n] = ab[i + n * n] / len;
      }

      conv = 0.0;
      for (i = 0; i < n; i++)
        conv += (vectors[i + k * n] - ab[i + n * n]) *
                (vectors[i + k * n] - ab[i + n * n]);
      convm = 0.0;
      for (i = 0; i < n; i++)
        convm += (vectors[i + k * n] + ab[i + n * n]) *
                 (vectors[i + k * n] + ab[i + n * n]);

      conv = MIN(conv, convm);

      for (i = 0; i < n; i++) vectors[i + k * n] = ab[i + n * n];

      if (iter > 100000) {
        printf("vectr %d conv %e used %d\n", k, conv, iter);
        break;
      }
    }
  }

  ref_free(r);
  ref_free(q);
  ref_free(rq);
  ref_free(qq);
  ref_free(ab);

  return REF_SUCCESS;
}